

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O3

void InitPresetArray(void)

{
  int iVar1;
  RookCannonCanGet *pRVar2;
  RookCannonMask *pRVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int (*paaiVar9) [2] [10];
  uint uVar10;
  long lVar11;
  int (*paaiVar12) [2] [10];
  int j_1;
  UINT16 UVar13;
  int j;
  ushort uVar14;
  uint uVar15;
  uint uVar16;
  int (*paaiVar17) [2] [10];
  UINT8 UVar18;
  uint uVar19;
  int iVar20;
  int (*paaiVar21) [2] [10];
  long lVar22;
  int iVar23;
  int (*paaiVar24) [2] [10];
  ulong uVar25;
  ushort uVar26;
  int i;
  byte bVar27;
  int i_1;
  int iVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  int i_2;
  UINT8 local_61;
  uint local_60;
  int local_5c;
  uint local_58;
  int local_54;
  
  memset(HORSE_CAN_GET,0,0x2800);
  paaiVar9 = PAWN_CAN_GET;
  paaiVar12 = ADVISOR_CAN_GET;
  paaiVar17 = BISHOP_EYE;
  paaiVar21 = KING_CAN_GET;
  paaiVar24 = BISHOP_CAN_GET;
  uVar31 = 0;
  do {
    lVar11 = 0;
    do {
      *(undefined4 *)((long)(*paaiVar24)[0] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar24)[1] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar21)[0] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar21)[1] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar17)[0] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar17)[1] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar12)[0] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar12)[1] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar9)[0] + lVar11) = 0;
      *(undefined4 *)((long)(*paaiVar9)[1] + lVar11) = 0;
      lVar11 = lVar11 + 4;
    } while (lVar11 != 0x28);
    if (""[uVar31] == '\0') {
      UVar13 = 0;
    }
    else {
      UVar13 = (UINT16)(1 << (0xb - ((byte)uVar31 & 0xf) & 0x1f));
      BIT_COL_MASK[uVar31] = (UINT16)(1 << (0xcU - (char)(uVar31 >> 4) & 0x1f));
    }
    BIT_ROW_MASK[uVar31] = UVar13;
    uVar31 = uVar31 + 1;
    paaiVar9 = paaiVar9 + 1;
    paaiVar12 = paaiVar12 + 1;
    paaiVar17 = paaiVar17 + 1;
    paaiVar21 = paaiVar21 + 1;
    paaiVar24 = paaiVar24 + 1;
  } while (uVar31 != 0x100);
  uVar7 = 0x33;
  do {
    lVar11 = (long)(int)uVar7;
    bVar27 = LEGAL_POSITION[0][lVar11];
    if ((bVar27 & 2) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)KING_DIRECTION + lVar22) + lVar11;
        if ((LEGAL_POSITION[0][lVar29] & 2) != 0) {
          KING_CAN_GET[lVar11][0][iVar30] = (int)lVar29;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x10);
    }
    bVar4 = LEGAL_POSITION[1][lVar11];
    if ((bVar4 & 2) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)KING_DIRECTION + lVar22) + lVar11;
        if ((LEGAL_POSITION[1][lVar29] & 2) != 0) {
          *(int *)(lVar11 * 0x50 + 0x2efd78 + (long)iVar30 * 4) = (int)lVar29;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x10);
    }
    if ((bVar27 & 4) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)ADVISOR_DIRECTION + lVar22) + lVar11;
        if ((LEGAL_POSITION[0][lVar29] & 4) != 0) {
          ADVISOR_CAN_GET[lVar11][0][iVar30] = (int)lVar29;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x10);
    }
    if ((bVar4 & 4) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)ADVISOR_DIRECTION + lVar22) + lVar11;
        if ((LEGAL_POSITION[1][lVar29] & 4) != 0) {
          *(int *)(lVar11 * 0x50 + 0x2f4d78 + (long)iVar30 * 4) = (int)lVar29;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x10);
    }
    if ((bVar27 & 0x10) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)BISHOP_DIRECTION + lVar22) + lVar11;
        if ((LEGAL_POSITION[0][lVar29] & 0x10) != 0) {
          BISHOP_CAN_GET[lVar11][0][iVar30] = (int)lVar29;
          BISHOP_EYE[lVar11][0][iVar30] = *(int *)((long)BISHOP_EYE_DIRECTION + lVar22) + uVar7;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x10);
    }
    if ((bVar4 & 0x10) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)BISHOP_DIRECTION + lVar22) + lVar11;
        if ((LEGAL_POSITION[1][lVar29] & 0x10) != 0) {
          *(int *)(lVar11 * 0x50 + 0x2fed78 + (long)iVar30 * 4) = (int)lVar29;
          *(uint *)(lVar11 * 0x50 + 0x303d78 + (long)iVar30 * 4) =
               *(int *)((long)BISHOP_EYE_DIRECTION + lVar22) + uVar7;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x10);
    }
    if ((bVar27 & 1) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)HORSE_DIRECTION + lVar22) + lVar11;
        if ((LEGAL_POSITION[0][lVar29] & 1) != 0) {
          HORSE_CAN_GET[lVar11][iVar30] = (int)lVar29;
          HORSE_LEG[lVar11][iVar30] = *(int *)((long)HORSE_LEG_DIRECTION + lVar22) + uVar7;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0x20);
    }
    if ((bVar27 & 8) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = *(int *)((long)PAWN_DIRECTION[0] + lVar22) + lVar11;
        if ((LEGAL_POSITION[0][lVar29] & 8) != 0) {
          PAWN_CAN_GET[lVar11][0][iVar30] = (int)lVar29;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 4;
      } while (lVar22 != 0xc);
    }
    if ((bVar4 & 8) != 0) {
      lVar22 = 0;
      iVar30 = 0;
      do {
        lVar29 = PAWN_DIRECTION[1][lVar22] + lVar11;
        if ((LEGAL_POSITION[1][lVar29] & 8) != 0) {
          *(int *)(lVar11 * 0x50 + 0x2f9d78 + (long)iVar30 * 4) = (int)lVar29;
          iVar30 = iVar30 + 1;
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 3);
    }
    uVar19 = uVar7 & 0xf;
    uVar16 = uVar7 + 8;
    if (uVar7 == 0xcb) {
      uVar16 = 0;
    }
    uVar7 = uVar7 + 1;
    if (uVar19 == 0xb) {
      uVar7 = uVar16;
    }
  } while (uVar7 != 0);
  uVar7 = 7;
  local_54 = -2;
  local_58 = 9;
  local_5c = -1;
  local_60 = 10;
  uVar31 = 0;
LAB_00107bb8:
  lVar11 = 0;
LAB_00107bf9:
  pRVar2 = ROOK_CANNON_CAN_GET_ROW[uVar31] + lVar11;
  pRVar3 = ROOK_CANNON_CAN_GET_ROW_MASK[uVar31] + lVar11;
  *pRVar2 = (RookCannonCanGet)((ulong)((uint)uVar31 + 3 & 0xff) * 0x101010101010101);
  pRVar3->no_capture = 0;
  pRVar3->rook_capture = 0;
  pRVar3->cannon_capture = 0;
  pRVar3->supercannon_capture = 0;
  uVar19 = 0;
  uVar16 = (uint)lVar11;
  if (uVar31 < 8) {
    uVar25 = uVar31 & 0xffffffff;
    uVar10 = uVar7;
    do {
      bVar27 = (byte)uVar10 & 0x1f;
      uVar15 = 1 << bVar27;
      uVar14 = (ushort)uVar15;
      if ((uVar16 >> (uVar10 & 0x1f) & 1) != 0) {
        pRVar2->rook_capture[0] = (char)uVar25 + '\x04';
        pRVar3->rook_capture = uVar14;
        uVar10 = (uint)uVar25;
        goto LAB_00107c6d;
      }
      uVar8 = (uint)uVar25 + 1;
      pRVar2->no_capture[0] = (char)uVar25 + '\x04';
      uVar19 = uVar19 | uVar15;
      pRVar3->no_capture = (UINT16)uVar19;
      uVar10 = uVar10 - 1;
      uVar25 = (ulong)uVar8;
    } while (uVar8 != 8);
    uVar15 = 10;
    uVar14 = (ushort)(0 << bVar27);
LAB_00107ca4:
    iVar30 = 0;
  }
  else {
    uVar14 = 0;
    uVar10 = (uint)uVar31;
LAB_00107c6d:
    uVar15 = uVar10 + 2;
    iVar30 = 0;
    if (uVar10 < 7) {
      iVar23 = iVar30;
      do {
        uVar8 = (6 - uVar10) + iVar23;
        iVar30 = 1 << ((byte)uVar8 & 0x1f);
        if ((uVar16 >> (uVar8 & 0x1f) & 1) != 0) {
          pRVar2->cannon_capture[0] = ((char)uVar10 + '\x05') - (char)iVar23;
          pRVar3->cannon_capture = (UINT16)iVar30;
          uVar15 = uVar15 - iVar23;
          goto LAB_00107cbf;
        }
        iVar23 = iVar23 + -1;
      } while (uVar10 - 7 != iVar23);
      uVar15 = 9;
      goto LAB_00107ca4;
    }
  }
LAB_00107cbf:
  uVar10 = 8;
  if (8 < uVar15) {
    uVar10 = uVar15;
  }
  uVar8 = uVar15 + 3;
  uVar15 = 7 - uVar15;
  do {
    if (uVar10 + uVar15 == 7) {
      uVar26 = 0;
      goto LAB_00107d04;
    }
    uVar26 = (ushort)(1 << ((byte)uVar15 & 0x1f));
    bVar27 = (char)uVar8 + 1;
    uVar8 = (uint)bVar27;
    uVar6 = uVar15 & 0x1f;
    uVar15 = uVar15 - 1;
  } while ((uVar16 >> uVar6 & 1) == 0);
  pRVar2->supercannon_capture[0] = bVar27;
  pRVar3->supercannon_capture = uVar26;
LAB_00107d04:
  uVar10 = local_60;
  uVar15 = local_58;
  iVar23 = local_54;
  iVar20 = local_5c;
  if (uVar31 != 0) {
    do {
      iVar28 = iVar23 + 2;
      uVar8 = 1 << ((byte)uVar15 & 0x1f);
      if ((uVar16 >> (uVar15 & 0x1f) & 1) != 0) {
        pRVar2->rook_capture[1] = (char)iVar23 + '\x04';
        pRVar3->rook_capture = uVar14 | (ushort)uVar8;
        if (iVar28 < 2) goto LAB_00107d54;
        goto LAB_00107da9;
      }
      pRVar2->no_capture[1] = (char)iVar23 + '\x04';
      uVar19 = uVar19 | uVar8;
      pRVar3->no_capture = (UINT16)uVar19;
      uVar10 = uVar10 + 1;
      uVar15 = uVar15 + 1;
      iVar23 = iVar23 + -1;
      iVar20 = iVar20 + -1;
    } while (1 < iVar28);
  }
  iVar23 = -2;
  goto LAB_00107d54;
  while( true ) {
    uVar10 = uVar10 + 1;
    iVar23 = iVar20 + -1;
    bVar5 = iVar20 < 1;
    iVar20 = iVar23;
    if (iVar23 == 0 || bVar5) break;
LAB_00107da9:
    if ((uVar16 >> (uVar10 & 0x1f) & 1) != 0) {
      pRVar2->cannon_capture[1] = (char)iVar20 + '\x02';
      pRVar3->cannon_capture = (ushort)iVar30 | (ushort)(1 << ((byte)uVar10 & 0x1f));
      iVar23 = iVar20 + -1;
      goto LAB_00107d54;
    }
  }
  iVar23 = -1;
LAB_00107d54:
  uVar19 = 9 - iVar23;
  do {
    if (iVar23 < 1) goto LAB_00107d83;
    bVar27 = (byte)uVar19;
    iVar23 = iVar23 + -1;
    uVar10 = uVar19 & 0x1f;
    uVar19 = uVar19 + 1;
  } while ((uVar16 >> uVar10 & 1) == 0);
  pRVar2->supercannon_capture[1] = (char)iVar23 + '\x03';
  pRVar3->supercannon_capture = uVar26 | (ushort)(1 << (bVar27 & 0x1f));
LAB_00107d83:
  lVar11 = lVar11 + 1;
  if (lVar11 == 0x200) goto LAB_00107dde;
  goto LAB_00107bf9;
LAB_00107dde:
  uVar31 = uVar31 + 1;
  uVar7 = uVar7 - 1;
  local_54 = local_54 + 1;
  local_58 = local_58 - 1;
  local_5c = local_5c + 1;
  local_60 = local_60 - 1;
  if (uVar31 == 9) goto code_r0x00107dff;
  goto LAB_00107bb8;
code_r0x00107dff:
  local_61 = '\x04';
  iVar30 = 0;
  local_54 = -2;
  local_58 = 10;
  local_5c = -1;
  local_60 = 0xb;
  uVar31 = 0;
LAB_00107e30:
  lVar11 = 0;
LAB_00107e71:
  pRVar2 = ROOK_CANNON_CAN_GET_COL[uVar31] + lVar11;
  pRVar3 = ROOK_CANNON_CAN_GET_COL_MASK[uVar31] + lVar11;
  *pRVar2 = (RookCannonCanGet)((ulong)((uint)uVar31 + 3 & 0xff) * 0x101010101010101);
  pRVar3->no_capture = 0;
  pRVar3->rook_capture = 0;
  pRVar3->cannon_capture = 0;
  pRVar3->supercannon_capture = 0;
  uVar16 = 0;
  uVar7 = (uint)lVar11;
  UVar18 = local_61;
  iVar23 = iVar30;
  if (uVar31 < 9) {
    do {
      bVar27 = (byte)(iVar23 + 8U) & 0x1f;
      uVar19 = 1 << bVar27;
      uVar14 = (ushort)uVar19;
      if ((uVar7 >> (iVar23 + 8U & 0x1f) & 1) != 0) {
        pRVar2->rook_capture[0] = UVar18;
        pRVar3->rook_capture = uVar14;
        uVar19 = -iVar23;
        goto LAB_00107eea;
      }
      pRVar2->no_capture[0] = UVar18;
      uVar16 = uVar16 | uVar19;
      pRVar3->no_capture = (UINT16)uVar16;
      iVar23 = iVar23 + -1;
      UVar18 = UVar18 + '\x01';
    } while (iVar23 != -9);
    uVar10 = 0xb;
    uVar14 = (ushort)(0 << bVar27);
LAB_00107f1f:
    iVar23 = 0;
  }
  else {
    uVar14 = 0;
    uVar19 = (uint)uVar31;
LAB_00107eea:
    uVar10 = uVar19 + 2;
    iVar20 = 0;
    iVar23 = iVar20;
    if (uVar19 < 8) {
      do {
        uVar15 = (7 - uVar19) + iVar20;
        iVar23 = 1 << ((byte)uVar15 & 0x1f);
        if ((uVar7 >> (uVar15 & 0x1f) & 1) != 0) {
          pRVar2->cannon_capture[0] = ((char)uVar19 + '\x05') - (char)iVar20;
          pRVar3->cannon_capture = (UINT16)iVar23;
          uVar10 = uVar10 - iVar20;
          goto LAB_00107f37;
        }
        iVar20 = iVar20 + -1;
      } while (uVar19 - 8 != iVar20);
      uVar10 = 10;
      goto LAB_00107f1f;
    }
  }
LAB_00107f37:
  uVar19 = 9;
  if (9 < uVar10) {
    uVar19 = uVar10;
  }
  uVar15 = uVar10 + 3;
  uVar10 = 8 - uVar10;
  do {
    if (uVar19 + uVar10 == 8) {
      uVar26 = 0;
      goto LAB_00107f7c;
    }
    uVar26 = (ushort)(1 << ((byte)uVar10 & 0x1f));
    bVar27 = (char)uVar15 + 1;
    uVar15 = (uint)bVar27;
    uVar8 = uVar10 & 0x1f;
    uVar10 = uVar10 - 1;
  } while ((uVar7 >> uVar8 & 1) == 0);
  pRVar2->supercannon_capture[0] = bVar27;
  pRVar3->supercannon_capture = uVar26;
LAB_00107f7c:
  uVar19 = local_60;
  iVar20 = local_5c;
  uVar10 = local_58;
  iVar28 = local_54;
  if (uVar31 != 0) {
    do {
      iVar1 = iVar28 + 2;
      uVar15 = 1 << ((byte)uVar10 & 0x1f);
      if ((uVar7 >> (uVar10 & 0x1f) & 1) != 0) {
        pRVar2->rook_capture[1] = (char)iVar28 + '\x04';
        pRVar3->rook_capture = uVar14 | (ushort)uVar15;
        if (iVar1 < 2) goto LAB_00107fc9;
        goto LAB_0010801f;
      }
      pRVar2->no_capture[1] = (char)iVar28 + '\x04';
      uVar16 = uVar16 | uVar15;
      pRVar3->no_capture = (UINT16)uVar16;
      uVar19 = uVar19 + 1;
      iVar20 = iVar20 + -1;
      uVar10 = uVar10 + 1;
      iVar28 = iVar28 + -1;
    } while (1 < iVar1);
  }
  iVar28 = -2;
  goto LAB_00107fc9;
  while( true ) {
    uVar19 = uVar19 + 1;
    iVar28 = iVar20 + -1;
    bVar5 = iVar20 < 1;
    iVar20 = iVar28;
    if (iVar28 == 0 || bVar5) break;
LAB_0010801f:
    if ((uVar7 >> (uVar19 & 0x1f) & 1) != 0) {
      pRVar2->cannon_capture[1] = (char)iVar20 + '\x02';
      pRVar3->cannon_capture = (ushort)iVar23 | (ushort)(1 << ((byte)uVar19 & 0x1f));
      iVar28 = iVar20 + -1;
      goto LAB_00107fc9;
    }
  }
  iVar28 = -1;
LAB_00107fc9:
  uVar16 = 10 - iVar28;
  do {
    if (iVar28 < 1) goto LAB_00107ff8;
    bVar27 = (byte)uVar16;
    iVar28 = iVar28 + -1;
    uVar19 = uVar16 & 0x1f;
    uVar16 = uVar16 + 1;
  } while ((uVar7 >> uVar19 & 1) == 0);
  pRVar2->supercannon_capture[1] = (char)iVar28 + '\x03';
  pRVar3->supercannon_capture = uVar26 | (ushort)(1 << (bVar27 & 0x1f));
LAB_00107ff8:
  lVar11 = lVar11 + 1;
  if (lVar11 == 0x400) goto LAB_00108055;
  goto LAB_00107e71;
LAB_00108055:
  uVar31 = uVar31 + 1;
  local_61 = local_61 + '\x01';
  iVar30 = iVar30 + -1;
  local_54 = local_54 + 1;
  local_58 = local_58 - 1;
  local_5c = local_5c + 1;
  local_60 = local_60 - 1;
  if (uVar31 == 10) {
    return;
  }
  goto LAB_00107e30;
}

Assistant:

void InitPresetArray(){
    // 1. 初始化预置数组
    for(int i = 0; i < 256; i ++){
        // 1.1. 初始化其他预置数组
        for(int j = 0; j < 10; j ++){
            HORSE_CAN_GET[i][j] = 0;
            HORSE_CAN_GET[i][j] = 0;
            BISHOP_CAN_GET[i][0][j] = 0;
            BISHOP_CAN_GET[i][1][j] = 0;
            KING_CAN_GET[i][0][j] = 0;
            KING_CAN_GET[i][1][j] = 0;
            BISHOP_EYE[i][0][j] = 0;
            BISHOP_EYE[i][1][j] = 0;
            ADVISOR_CAN_GET[i][0][j] = 0;
            ADVISOR_CAN_GET[i][1][j] = 0;
            PAWN_CAN_GET[i][0][j] = 0;
            PAWN_CAN_GET[i][1][j] = 0;
        }

        // 1.2. 初始化位行位列屏蔽位
        if(ON_BOARD[i]){
            BIT_ROW_MASK[i] = 1 << RowBitOpration(GetCol(i) - 3);
            BIT_COL_MASK[i] = 1 << ColBitOpration(GetRow(i) - 3);
        }
        else{
            BIT_ROW_MASK[i] = 0;
            BIT_ROW_MASK[i] = 0;
        }
    }
    int position = BOARD_FIRST_POSITION;    // 初始位置为棋盘上的第一个位置

    // 2.循环棋盘上的每一个位置
    //   (备注： POSITION_MASK[7] = {2, 4, 16, 1, 1, 1, 8} 各子力的特征值 将士相车马炮卒)
    while(position != 0){
        int num_of_can_get = 0;             // 预生成着法的个数
        int next_position;                  // 着后的下一个位置

        // 2.1. 生成帅（红）的在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.2. 生成将（黑）在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[0]){
            for(int i = 0; i < 4; i ++){
                next_position = position + KING_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[0]){
                    KING_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        
        // 2.3. 生成仕(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][RED][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.3. 生成士(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[1]){
            for(int i = 0; i < 4; i ++){
                next_position = position + ADVISOR_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[1]){
                    ADVISOR_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.4. 生成象(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][RED][num_of_can_get] = next_position;
                    BISHOP_EYE[position][RED][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.5. 生成象(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[2]){
            for(int i = 0; i < 4; i ++){
                next_position = position + BISHOP_DIRECTION[i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[2]){
                    BISHOP_CAN_GET[position][BLACK][num_of_can_get] = next_position;
                    BISHOP_EYE[position][BLACK][num_of_can_get] = position + BISHOP_EYE_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.6. 生成马在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[4]){
            for(int i = 0; i < 8; i ++){
                next_position = position + HORSE_DIRECTION[i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[4]){
                    HORSE_CAN_GET[position][num_of_can_get] = next_position;
                    HORSE_LEG[position][num_of_can_get] = position + HORSE_LEG_DIRECTION[i];
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.7. 生成兵(红)在该位置的可行走法
        if(LEGAL_POSITION[RED][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[RED][i];
                if(LEGAL_POSITION[RED][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][RED][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        // 2.8. 生成兵(黑)在该位置的可行走法
        if(LEGAL_POSITION[BLACK][position] & POSITION_MASK[6]){
            for(int i = 0; i < 3; i ++){
                next_position = position + PAWN_DIRECTION[BLACK][i];
                if(LEGAL_POSITION[BLACK][next_position] & POSITION_MASK[6]){
                    PAWN_CAN_GET[position][BLACK][num_of_can_get] = next_position; 
                    num_of_can_get ++;
                }
            }
        }
        num_of_can_get = 0;

        position = NextBoardPosition(position);
    }

    // 3.生成位行位列预置数组
    
    // 3.1. 循环一行中的每一列
    for(int i = 0; i < 9; i ++){
        // 循环一行中的每种状态(位置是否有棋子)
        for(int j = 0; j < (1 << 9); j ++){
            // 3.1.1 将着法初始化(用当前位置初始化)
            ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture = 0;
            int col;
            // 3.1.2 生成车炮右边的着法
            for(col = i + 1; col < 9; col ++){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col ++; col < 9; col ++){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[0] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            // 3.1.3 生成车炮左边的着法
            for(col = i - 1; col >= 0; col--){
                // 此状态下，该列没有棋子
                if((j & (1 << RowBitOpration(col))) == 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].no_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].no_capture |= (1 << RowBitOpration(col));
                }
                // 此状态下，该列有棋子,可生成吃子着法
                else{
                    ROOK_CANNON_CAN_GET_ROW[i][j].rook_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].rook_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了一子，判断炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].cannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].cannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
            for(col --; col >= 0; col --){
                // 已经隔了两子，判断超级炮是否有吃子着法
                if((j & (1 << RowBitOpration(col))) != 0){
                    ROOK_CANNON_CAN_GET_ROW[i][j].supercannon_capture[1] = col + 3;
                    ROOK_CANNON_CAN_GET_ROW_MASK[i][j].supercannon_capture |= (1 << RowBitOpration(col));
                    break;
                }
            }
        }
    }
    // 3.2. 循环一列中的每一行
    for(int i = 0; i < 10; i ++){
        // 循环一列的每一个状态
        for(int j = 0; j < (1 << 10); j ++){
            // 3.2.1 着法初始化
            ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = i + 3;
            ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture = ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture = 0;
            // 3.2.2 生成车炮向下的着法 
            int row;
            for(row = i + 1; row < 10; row ++){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row ++; row < 10; row ++){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[0] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            // 3.2.3 生成车炮向上的着法
            for(row = i - 1; row >= 0; row --){
                // 当前状态下该行无棋子
                if((j & (1 << ColBitOpration(row))) == 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].no_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].no_capture |= (1 << ColBitOpration(row));
                }
                // 当前状态下该行有棋子
                else{
                    ROOK_CANNON_CAN_GET_COL[i][j].rook_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].rook_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了一子，生成炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].cannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].cannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
            for(row --; row >= 0; row --){
                // 隔了两子，生成超级炮吃法
                if((j & (1 << ColBitOpration(row))) != 0){
                    ROOK_CANNON_CAN_GET_COL[i][j].supercannon_capture[1] = row + 3;
                    ROOK_CANNON_CAN_GET_COL_MASK[i][j].supercannon_capture |= (1 << ColBitOpration(row));
                    break;
                }
            }
        }
    }  
}